

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilSupp.c
# Opt level: O3

void Abc_SuppTest(int nOnes,int nVars,int fUseSimple,int fCheck,int fVerbose)

{
  int iVar1;
  uint uVar2;
  Vec_Wrd_t *p;
  Vec_Wrd_t *p_00;
  long lVar3;
  long lVar4;
  int iVar5;
  timespec ts_3;
  word Matrix [64];
  timespec local_248;
  timespec local_238 [32];
  
  iVar1 = clock_gettime(3,local_238);
  if (iVar1 < 0) {
    lVar3 = 1;
  }
  else {
    lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_238[0].tv_nsec),8);
    lVar3 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_238[0].tv_sec * -1000000;
  }
  p = Abc_SuppGen(nOnes,nVars);
  if (fUseSimple == 0) {
    p_00 = Abc_SuppGenPairs(p,nVars);
  }
  else {
    p_00 = Abc_SuppGenPairs2(nOnes,nVars);
  }
  if (nVars < 100) {
    printf("M = %2d  N = %2d : ",nOnes,nVars);
    uVar2 = p->nSize;
    printf("K = %6d   ",(ulong)uVar2);
    printf("Total = %12.0f  ",(double)(int)(uVar2 - 1) * (double)(int)uVar2 * 0.5);
    printf("Distinct = %8d  ",(ulong)(uint)p_00->nSize);
    iVar5 = 3;
    iVar1 = clock_gettime(3,local_238);
    if (iVar1 < 0) {
      lVar4 = -1;
    }
    else {
      lVar4 = local_238[0].tv_nsec / 1000 + local_238[0].tv_sec * 1000000;
    }
    Abc_Print(iVar5,"%s =","Reduction time");
    Abc_Print(iVar5,"%9.2f sec\n",(double)(lVar4 + lVar3) / 1000000.0);
    iVar1 = clock_gettime(3,local_238);
    if (iVar1 < 0) {
      lVar3 = 1;
    }
    else {
      lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_238[0].tv_nsec),8);
      lVar3 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_238[0].tv_sec * -1000000;
    }
    uVar2 = Abc_SuppMinimize((word *)local_238,p_00,nVars,fVerbose);
    printf("Solution with %d variables found.  ",(ulong)uVar2);
    iVar5 = 3;
    iVar1 = clock_gettime(3,&local_248);
    if (iVar1 < 0) {
      lVar4 = -1;
    }
    else {
      lVar4 = local_248.tv_nsec / 1000 + local_248.tv_sec * 1000000;
    }
    Abc_Print(iVar5,"%s =","Covering time");
    Abc_Print(iVar5,"%9.2f sec\n",(double)(lVar4 + lVar3) / 1000000.0);
    if (fCheck != 0) {
      Abc_SuppVerify(p,(word *)local_238,nVars,uVar2);
    }
    if (p_00->pArray != (word *)0x0) {
      free(p_00->pArray);
    }
    free(p_00);
    if (p->pArray != (word *)0x0) {
      free(p->pArray);
    }
    free(p);
    return;
  }
  __assert_fail("nVars < 100",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilSupp.c"
                ,0x113,"void Abc_SuppTest(int, int, int, int, int)");
}

Assistant:

void Abc_SuppTest( int nOnes, int nVars, int fUseSimple, int fCheck, int fVerbose )
{
    int nVarsMin;
    word Matrix[64];
    abctime clk = Abc_Clock();
    // create the problem
    Vec_Wrd_t * vRes = Abc_SuppGen( nOnes, nVars );
    Vec_Wrd_t * vPairs = fUseSimple ? Abc_SuppGenPairs2( nOnes, nVars ) : Abc_SuppGenPairs( vRes, nVars );
    assert( nVars < 100 );
    printf( "M = %2d  N = %2d : ", nOnes, nVars );
    printf( "K = %6d   ",  Vec_WrdSize(vRes) );
    printf( "Total = %12.0f  ", 0.5 * Vec_WrdSize(vRes) * (Vec_WrdSize(vRes) - 1) );
    printf( "Distinct = %8d  ",  Vec_WrdSize(vPairs) );
    Abc_PrintTime( 1, "Reduction time", Abc_Clock() - clk );
    // solve the problem
    clk = Abc_Clock();
    nVarsMin = Abc_SuppMinimize( Matrix, vPairs, nVars, fVerbose );
    printf( "Solution with %d variables found.  ", nVarsMin );
    Abc_PrintTime( 1, "Covering time", Abc_Clock() - clk );
    if ( fCheck )
        Abc_SuppVerify( vRes, Matrix, nVars, nVarsMin );
    Vec_WrdFree( vPairs );
    Vec_WrdFree( vRes );
}